

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<TCBPoint>::emplace<TCBPoint>
          (QPodArrayOps<TCBPoint> *this,qsizetype i,TCBPoint *args)

{
  bool bVar1;
  qsizetype qVar2;
  TCBPoint *pTVar3;
  void *in_RDX;
  QArrayDataPointer<TCBPoint> *in_RSI;
  QArrayDataPointer<TCBPoint> *in_RDI;
  long in_FS_OFFSET;
  TCBPoint *where;
  GrowthPosition pos;
  bool detach;
  TCBPoint tmp;
  QArrayDataPointer<TCBPoint> *in_stack_ffffffffffffffa8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar5;
  GrowthPosition where_00;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<TCBPoint>::needsDetach(in_RDI);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb4);
  if (!bVar1) {
    if ((in_RSI == (QArrayDataPointer<TCBPoint> *)in_RDI->size) &&
       (qVar2 = QArrayDataPointer<TCBPoint>::freeSpaceAtEnd(in_stack_ffffffffffffffa8), qVar2 != 0))
    {
      pTVar3 = QArrayDataPointer<TCBPoint>::end(in_RDI);
      memcpy(pTVar3,in_RDX,0x28);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0071da9e;
    }
    if ((in_RSI == (QArrayDataPointer<TCBPoint> *)0x0) &&
       (qVar2 = QArrayDataPointer<TCBPoint>::freeSpaceAtBegin(in_stack_ffffffffffffffa8), qVar2 != 0
       )) {
      pTVar3 = QArrayDataPointer<TCBPoint>::begin((QArrayDataPointer<TCBPoint> *)0x71d989);
      memcpy(pTVar3 + -1,in_RDX,0x28);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0071da9e;
    }
  }
  memset(&local_30,0,0x28);
  local_30 = 0xffffffffffffffff;
  local_28 = 0xffffffffffffffff;
  local_20 = 0xffffffffffffffff;
  local_18 = 0xffffffffffffffff;
  local_10 = 0xffffffffffffffff;
  memcpy(&local_30,in_RDX,0x28);
  where_00 = (GrowthPosition)((ulong)in_RDX >> 0x20);
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<TCBPoint> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<TCBPoint>::detachAndGrow
            (in_RSI,where_00,CONCAT44(uVar5,uVar4),(TCBPoint **)in_stack_ffffffffffffffa8,in_RDI);
  pTVar3 = createHole((QPodArrayOps<TCBPoint> *)in_RSI,where_00,CONCAT44(uVar5,uVar4),
                      (qsizetype)in_stack_ffffffffffffffa8);
  memcpy(pTVar3,&local_30,0x28);
LAB_0071da9e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }